

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_generator_next(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,
                         int magic)

{
  JSAsyncFunctionState *s;
  int *piVar1;
  ulong *puVar2;
  long lVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  int64_t iVar5;
  JSRefCountHeader *p_3;
  uint uVar6;
  ulong uVar7;
  JSRefCountHeader *p;
  int *piVar8;
  JSValue JVar9;
  
  if (((int)this_val.tag != -1) || (*(short *)((long)this_val.u.ptr + 6) != 0x28)) {
    *pdone = 1;
LAB_001699d5:
    JS_ThrowTypeError(ctx,"not a generator",this_val.tag,CONCAT44(in_register_0000000c,argc));
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  piVar1 = *(int **)((long)this_val.u.ptr + 0x30);
  *pdone = 1;
  if (piVar1 == (int *)0x0) goto LAB_001699d5;
  s = (JSAsyncFunctionState *)(piVar1 + 2);
  iVar4 = *piVar1;
  if (iVar4 - 1U < 2) {
    piVar8 = (int *)(argv->u).ptr;
    iVar5 = argv->tag;
    JVar9 = *argv;
    if (0xfffffff4 < (uint)iVar5) {
      *piVar8 = *piVar8 + 1;
    }
    if (iVar4 == 1 && magic == 2) {
      JS_Throw(ctx,JVar9);
      iVar4 = 1;
    }
    else {
      lVar3 = *(long *)(piVar1 + 0x1a);
      *(int **)(lVar3 + -0x10) = piVar8;
      *(int64_t *)(lVar3 + -8) = iVar5;
      puVar2 = *(ulong **)(piVar1 + 0x1a);
      *puVar2 = (ulong)(uint)magic;
      puVar2[1] = 0;
      *(long *)(piVar1 + 0x1a) = *(long *)(piVar1 + 0x1a) + 0x10;
LAB_00169a71:
      iVar4 = 0;
    }
    piVar1[7] = iVar4;
    *piVar1 = 3;
    JVar9 = async_func_resume(ctx,s);
    *piVar1 = 1;
    uVar6 = (uint)JVar9.tag;
    if (uVar6 == 0) {
      lVar3 = *(long *)(piVar1 + 0x1a);
      piVar8 = *(int **)(lVar3 + -0x10);
      iVar5 = *(int64_t *)(lVar3 + -8);
      uVar7 = (ulong)piVar8 >> 0x20;
      *(undefined4 *)(lVar3 + -0x10) = 0;
      *(undefined8 *)(lVar3 + -8) = 3;
      if (JVar9.u._0_4_ == 2) {
        *piVar1 = 2;
        *pdone = 2;
      }
      else {
        *pdone = 0;
      }
    }
    else {
      if (uVar6 == 6) {
        async_func_free(ctx->rt,s);
        *piVar1 = 4;
        return JVar9;
      }
      lVar3 = *(long *)(piVar1 + 0x1a);
      piVar8 = *(int **)(lVar3 + -0x10);
      iVar5 = *(int64_t *)(lVar3 + -8);
      *(undefined4 *)(lVar3 + -0x10) = 0;
      *(undefined8 *)(lVar3 + -8) = 3;
      if ((0xfffffff4 < uVar6) &&
         (iVar4 = *JVar9.u.ptr, *(int *)JVar9.u.ptr = iVar4 + -1, iVar4 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar9);
      }
      uVar7 = (ulong)piVar8 >> 0x20;
      if (*piVar1 != 4) {
        async_func_free(ctx->rt,s);
        *piVar1 = 4;
      }
    }
  }
  else {
    if (iVar4 == 3) {
      JS_ThrowTypeError(ctx,"cannot invoke a running generator");
      iVar5 = 6;
    }
    else {
      if (iVar4 != 4) {
        if (magic == 0) goto LAB_00169a71;
        async_func_free(ctx->rt,s);
        *piVar1 = 4;
      }
      if (magic == 2) {
        JVar9 = *argv;
        if (0xfffffff4 < (uint)argv->tag) {
          *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
        }
        JS_Throw(ctx,JVar9);
        iVar5 = 6;
      }
      else {
        if (magic == 1) {
          piVar8 = (int *)(argv->u).ptr;
          iVar5 = argv->tag;
          if (0xfffffff4 < (uint)iVar5) {
            *piVar8 = *piVar8 + 1;
          }
          uVar7 = (ulong)piVar8 >> 0x20;
          goto LAB_00169b92;
        }
        iVar5 = 3;
      }
    }
    piVar8 = (int *)0x0;
    uVar7 = 0;
  }
LAB_00169b92:
  JVar9.tag = iVar5;
  JVar9.u.ptr = (void *)((ulong)piVar8 & 0xffffffff | uVar7 << 0x20);
  return JVar9;
}

Assistant:

static JSValue js_generator_next(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 BOOL *pdone, int magic)
{
    JSGeneratorData *s = JS_GetOpaque(this_val, JS_CLASS_GENERATOR);
    JSStackFrame *sf;
    JSValue ret, func_ret;

    *pdone = TRUE;
    if (!s)
        return JS_ThrowTypeError(ctx, "not a generator");
    sf = &s->func_state.frame;
    switch(s->state) {
    default:
    case JS_GENERATOR_STATE_SUSPENDED_START:
        if (magic == GEN_MAGIC_NEXT) {
            goto exec_no_arg;
        } else {
            free_generator_stack(ctx, s);
            goto done;
        }
        break;
    case JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR:
    case JS_GENERATOR_STATE_SUSPENDED_YIELD:
        /* cur_sp[-1] was set to JS_UNDEFINED in the previous call */
        ret = JS_DupValue(ctx, argv[0]);
        if (magic == GEN_MAGIC_THROW &&
            s->state == JS_GENERATOR_STATE_SUSPENDED_YIELD) {
            JS_Throw(ctx, ret);
            s->func_state.throw_flag = TRUE;
        } else {
            sf->cur_sp[-1] = ret;
            sf->cur_sp[0] = JS_NewInt32(ctx, magic);
            sf->cur_sp++;
        exec_no_arg:
            s->func_state.throw_flag = FALSE;
        }
        s->state = JS_GENERATOR_STATE_EXECUTING;
        func_ret = async_func_resume(ctx, &s->func_state);
        s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD;
        if (JS_IsException(func_ret)) {
            /* finalize the execution in case of exception */
            free_generator_stack(ctx, s);
            return func_ret;
        }
        if (JS_VALUE_GET_TAG(func_ret) == JS_TAG_INT) {
            /* get the returned yield value at the top of the stack */
            ret = sf->cur_sp[-1];
            sf->cur_sp[-1] = JS_UNDEFINED;
            if (JS_VALUE_GET_INT(func_ret) == FUNC_RET_YIELD_STAR) {
                s->state = JS_GENERATOR_STATE_SUSPENDED_YIELD_STAR;
                /* return (value, done) object */
                *pdone = 2;
            } else {
                *pdone = FALSE;
            }
        } else {
            /* end of iterator */
            ret = sf->cur_sp[-1];
            sf->cur_sp[-1] = JS_UNDEFINED;
            JS_FreeValue(ctx, func_ret);
            free_generator_stack(ctx, s);
        }
        break;
    case JS_GENERATOR_STATE_COMPLETED:
    done:
        /* execution is finished */
        switch(magic) {
        default:
        case GEN_MAGIC_NEXT:
            ret = JS_UNDEFINED;
            break;
        case GEN_MAGIC_RETURN:
            ret = JS_DupValue(ctx, argv[0]);
            break;
        case GEN_MAGIC_THROW:
            ret = JS_Throw(ctx, JS_DupValue(ctx, argv[0]));
            break;
        }
        break;
    case JS_GENERATOR_STATE_EXECUTING:
        ret = JS_ThrowTypeError(ctx, "cannot invoke a running generator");
        break;
    }
    return ret;
}